

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O2

bool __thiscall
nuraft::FakeNetwork::delieverReqTo(FakeNetwork *this,string *endpoint,bool random_order)

{
  const_iterator __position;
  SimpleLogger *this_00;
  pointer pcVar1;
  pointer pcVar2;
  element_type *peVar3;
  bool bVar4;
  FakeNetwork *msg;
  ptr<FakeClient> pVar5;
  ptr<resp_msg> pVar6;
  ptr<FakeClient> conn;
  RespPkg local_70;
  ptr<resp_msg> resp;
  
  pVar5 = findClient((FakeNetwork *)&conn,(string *)this);
  msg = (conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dstNet;
  if ((msg == (FakeNetwork *)0x0) || (msg->online == false)) {
    bVar4 = makeReqFail(this,endpoint,false);
  }
  else {
    __position._M_node =
         ((conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         pendingReqs).
         super__List_base<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    if (__position._M_node ==
        (_List_node_base *)
        &(conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         pendingReqs) {
      bVar4 = false;
    }
    else {
      this_00 = ((this->base).
                 super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                myLog;
      if ((this_00 != (SimpleLogger *)0x0) &&
         (3 < (this_00->curLogLevel).super___atomic_base<int>._M_i)) {
        pcVar1 = (this->myEndpoint)._M_dataplus._M_p;
        pcVar2 = (endpoint->_M_dataplus)._M_p;
        msg_type_to_string_abi_cxx11_
                  ((string *)&local_70,
                   (nuraft *)(ulong)*(uint *)&__position._M_node[1]._M_next[1]._M_next,
                   (msg_type)
                   pVar5.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        SimpleLogger::put(this_00,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                          ,"delieverReqTo",0xa7,"[BEGIN] send/process %s -> %s, %s",pcVar1,pcVar2,
                          local_70.resp.
                          super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::~string((string *)&local_70);
        msg = (conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              dstNet;
      }
      pVar6 = gotMsg((FakeNetwork *)&resp,(ptr<req_msg> *)msg);
      if ((this_00 != (SimpleLogger *)0x0) &&
         (3 < (this_00->curLogLevel).super___atomic_base<int>._M_i)) {
        pcVar1 = (this->myEndpoint)._M_dataplus._M_p;
        pcVar2 = (endpoint->_M_dataplus)._M_p;
        msg_type_to_string_abi_cxx11_
                  ((string *)&local_70,
                   (nuraft *)(ulong)*(uint *)&__position._M_node[1]._M_next[1]._M_next,
                   (msg_type)
                   pVar6.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        SimpleLogger::put(this_00,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                          ,"delieverReqTo",0xac,"[END] send/process %s -> %s, %s",pcVar1,pcVar2,
                          local_70.resp.
                          super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::~string((string *)&local_70);
      }
      peVar3 = conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      RespPkg::RespPkg(&local_70,&resp,(rpc_handler *)(__position._M_node + 2));
      std::__cxx11::
      list<nuraft::FakeNetwork::RespPkg,_std::allocator<nuraft::FakeNetwork::RespPkg>_>::push_back
                (&peVar3->pendingResps,&local_70);
      RespPkg::~RespPkg(&local_70);
      std::__cxx11::list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
      ::erase(&(conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               pendingReqs,__position);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      bVar4 = true;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar4;
}

Assistant:

bool FakeNetwork::delieverReqTo(const std::string& endpoint,
                                bool random_order)
{
    // this:                    source (sending request)
    // conn->dstNet (endpoint): destination (sending response)
    ptr<FakeClient> conn = findClient(endpoint);

    // If destination is offline, make failure.
    if (!conn->isDstOnline()) return makeReqFail(endpoint, random_order);

    auto pkg_entry = conn->pendingReqs.begin();
    if (pkg_entry == conn->pendingReqs.end()) return false;

    ReqPkg& pkg = *pkg_entry;

    SimpleLogger* ll = base->getLogger();
    _log_info(ll, "[BEGIN] send/process %s -> %s, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    ptr<resp_msg> resp = conn->dstNet->gotMsg( pkg.req );
    _log_info(ll, "[END] send/process %s -> %s, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    conn->pendingResps.push_back( FakeNetwork::RespPkg(resp, pkg.whenDone) );
    conn->pendingReqs.erase(pkg_entry);
    return true;
}